

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall crnlib::adaptive_huffman_data_model::reset(adaptive_huffman_data_model *this)

{
  uint uVar1;
  unsigned_short *puVar2;
  uint i;
  ulong uVar3;
  
  uVar1 = this->m_total_syms;
  if ((ulong)uVar1 != 0) {
    puVar2 = (this->m_sym_freq).m_p;
    uVar3 = 0;
    do {
      puVar2[uVar3] = 1;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    this->m_total_count = 0;
    this->m_update_cycle = uVar1;
    update(this);
    this->m_update_cycle = 8;
    this->m_symbols_until_update = 8;
  }
  return;
}

Assistant:

void adaptive_huffman_data_model::reset()
    {
        if (!m_total_syms)
        {
            return;
        }

        for (uint i = 0; i < m_total_syms; i++)
        {
            m_sym_freq[i] = 1;
        }

        m_total_count = 0;
        m_update_cycle = m_total_syms;

        update();

        m_symbols_until_update = m_update_cycle = 8; //(m_total_syms + 6) >> 1;
    }